

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O2

void __thiscall
Catch::UnaryExpr<const_slang::SourceLibrary_*&>::streamReconstructedExpression
          (UnaryExpr<const_slang::SourceLibrary_*&> *this,ostream *os)

{
  SourceLibrary **in_RDX;
  string local_30;
  
  Detail::stringify<slang::SourceLibrary_const*>(&local_30,(Detail *)this->m_lhs,in_RDX);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }